

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalTexture1DShadowProjGradOffset
               (ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float lod;
  float fVar3;
  
  fVar3 = c->in[0].m_data[0];
  fVar1 = c->in[0].m_data[2];
  fVar2 = c->in[0].m_data[3];
  lod = computeLodFromGrad1D(c);
  fVar3 = texture1DShadowOffset(c,fVar1 / fVar2,fVar3 / fVar2,lod,(p->offset).m_data[0]);
  (c->color).m_data[0] = fVar3;
  return;
}

Assistant:

static void		evalTexture1DShadowProjGradOffset	(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture1DShadowOffset(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), computeLodFromGrad1D(c), p.offset.x()); }